

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  short sVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  unsigned_long_long uVar10;
  uint *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t err_code_1;
  ulong uVar15;
  ulong uVar16;
  code *pcVar17;
  short *psVar18;
  size_t err_code_2;
  ulong uVar19;
  bool bVar20;
  undefined8 uVar21;
  ulong local_48 [3];
  
  sVar7 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (sVar7 < 0xffffffffffffff89) {
    uVar21 = 0x1249f48;
    sVar8 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      uVar21 = 0x1249f6c;
      XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    ZVar2 = (cctx->appliedParams).blockDelimiters;
    if (ZVar2 == ZSTD_sf_noBlockDelimiters) {
      pcVar17 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    else {
      pcVar17 = (code *)0x0;
    }
    if (ZVar2 == ZSTD_sf_explicitBlockDelimiters) {
      pcVar17 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    }
    psVar18 = (short *)((long)dst + sVar8);
    uVar19 = dstCapacity - sVar8;
    if (srcSize == 0) {
      if (uVar19 < 4) {
        return 0xffffffffffffffba;
      }
      psVar18[0] = 1;
      psVar18[1] = 0;
      uVar16 = 3;
    }
    else {
      uVar16 = 0;
      uVar15 = uVar19;
      do {
        uVar9 = cctx->blockSize;
        if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
          uVar14 = uVar9;
          if (srcSize < uVar9) {
            uVar14 = srcSize;
          }
          bVar20 = srcSize <= uVar9;
          if (0xffffffffffffff88 < uVar14) {
            return uVar14;
          }
        }
        else {
          uVar14 = local_48[0] & 0xffffffff;
          lVar13 = inSeqsSize - uVar14;
          if (inSeqsSize < uVar14 || lVar13 == 0) {
            return 0xffffffffffffff95;
          }
          puVar11 = &inSeqs[uVar14].matchLength;
          uVar14 = 0;
          while( true ) {
            uVar14 = (puVar11[-1] + *puVar11) + uVar14;
            if (((ZSTD_Sequence *)(puVar11 + -2))->offset == 0) break;
            puVar11 = puVar11 + 4;
            lVar13 = lVar13 + -1;
            if (lVar13 == 0) {
              return 0xffffffffffffff95;
            }
          }
          uVar12 = 0xffffffffffffff95;
          if (*puVar11 == 0) {
            uVar12 = uVar14;
          }
          if (0xffffffffffffff88 < uVar12) {
            return uVar12;
          }
          if (uVar9 < uVar12) {
            return 0xffffffffffffff95;
          }
          bVar20 = uVar12 == srcSize;
          if (srcSize < uVar12) {
            return 0xffffffffffffff95;
          }
        }
        (cctx->seqStore).lit = (cctx->seqStore).litStart;
        (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
        (cctx->seqStore).longLengthType = ZSTD_llt_none;
        uVar9 = (*pcVar17)(cctx,local_48,inSeqs,inSeqsSize,src,uVar14,
                           (cctx->appliedParams).searchForExternalRepcodes);
        if (0xffffffffffffff88 < uVar9) {
          return uVar9;
        }
        uVar14 = uVar14 - uVar9;
        sVar5 = (short)uVar14;
        if (uVar14 < 7) {
          uVar9 = uVar14 + 3;
          if (uVar15 < uVar9) {
            return 0xffffffffffffffba;
          }
          *psVar18 = (ushort)bVar20 + sVar5 * 8;
          *(undefined1 *)(psVar18 + 1) = 0;
          uVar21 = 0x124a12b;
          switchD_00b041bd::default((void *)((long)psVar18 + 3),src,uVar14);
          uVar16 = uVar16 + uVar9;
        }
        else {
          if (uVar15 < 3) {
            return 0xffffffffffffffba;
          }
          sVar7 = ZSTD_entropyCompressSeqStore
                            (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                             &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                             (void *)((long)psVar18 + 3),uVar15 - 3,uVar14,cctx->entropyWorkspace,
                             (ulong)(uint)cctx->bmi2,(int)uVar21);
          if (0xffffffffffffff88 < sVar7) {
            return sVar7;
          }
          if (((cctx->isFirstBlock == 0) &&
              ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) <
               0x20)) &&
             ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) {
            uVar21 = 0x124a25f;
            iVar6 = ZSTD_isRLE((BYTE *)src,uVar14);
            if (iVar6 == 0) goto LAB_0124a1be;
LAB_0124a26c:
            if (uVar15 == 3) {
              return 0xffffffffffffffba;
            }
            BVar1 = *src;
            *psVar18 = (ushort)bVar20 + sVar5 * 8 + 2;
            *(char *)(psVar18 + 1) = (char)(uVar14 >> 0xd);
            *(BYTE *)((long)psVar18 + 3) = BVar1;
            uVar9 = 4;
          }
          else {
LAB_0124a1be:
            if (sVar7 == 1) goto LAB_0124a26c;
            if (sVar7 == 0) {
              uVar9 = uVar14 + 3;
              if (uVar15 < uVar9) {
                return 0xffffffffffffffba;
              }
              *psVar18 = (ushort)bVar20 + sVar5 * 8;
              *(char *)(psVar18 + 1) = (char)(uVar14 >> 0xd);
              uVar21 = 0x124a205;
              switchD_00b041bd::default((void *)((long)psVar18 + 3),src,uVar14);
              if (0xffffffffffffff88 < uVar9) {
                return uVar9;
              }
            }
            else {
              pZVar3 = (cctx->blockState).prevCBlock;
              pZVar4 = (cctx->blockState).nextCBlock;
              (cctx->blockState).prevCBlock = pZVar4;
              (cctx->blockState).nextCBlock = pZVar3;
              if ((pZVar4->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
              *psVar18 = (ushort)bVar20 + (short)sVar7 * 8 + 4;
              *(char *)(psVar18 + 1) = (char)(sVar7 >> 0xd);
              uVar9 = sVar7 + 3;
            }
          }
          uVar16 = uVar16 + uVar9;
          if (bVar20 != false) break;
          cctx->isFirstBlock = 0;
        }
        uVar15 = uVar15 - uVar9;
        src = (void *)((long)src + uVar14);
        psVar18 = (short *)((long)psVar18 + uVar9);
        srcSize = srcSize - uVar14;
      } while (srcSize != 0);
      if (0xffffffffffffff88 < uVar16) {
        return uVar16;
      }
    }
    sVar8 = sVar8 + uVar16;
    sVar7 = sVar8;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      uVar10 = XXH64_digest(&cctx->xxhState);
      sVar7 = 0xffffffffffffffba;
      if (3 < uVar19 - uVar16) {
        *(int *)((long)dst + sVar8) = (int)uVar10;
        sVar7 = sVar8 + 4;
      }
    }
  }
  return sVar7;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}